

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O0

void QMetaType::registerNormalizedTypedef(QByteArray *normalizedTypeName,QMetaType metaType)

{
  bool bVar1;
  Type *pTVar2;
  QMetaTypeInterface **ppQVar3;
  QMetaTypeInterface *in_RSI;
  long in_FS_OFFSET;
  QMetaTypeInterface **al;
  Type *reg;
  QWriteLocker lock;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  *in_stack_ffffffffffffff98;
  QWriteLocker *in_stack_ffffffffffffffa0;
  QByteArray *key;
  QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*> *in_stack_ffffffffffffffb0;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d_ptr = in_RSI;
  bVar1 = isValid(&local_10);
  if ((bVar1) &&
     (pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
               ::operator()(in_stack_ffffffffffffff98), pTVar2 != (Type *)0x0)) {
    key = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QWriteLocker::QWriteLocker
              (in_stack_ffffffffffffffa0,(QReadWriteLock *)in_stack_ffffffffffffff98);
    ppQVar3 = QHash<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>::operator[]
                        (in_stack_ffffffffffffffb0,key);
    if (*ppQVar3 == (QMetaTypeInterface *)0x0) {
      *ppQVar3 = local_10.d_ptr;
    }
    QWriteLocker::~QWriteLocker((QWriteLocker *)0x38b993);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMetaType::registerNormalizedTypedef(const NS(QByteArray) & normalizedTypeName,
                                          QMetaType metaType)
{
    if (!metaType.isValid())
        return;
    if (auto reg = customTypeRegistry()) {
        QWriteLocker lock(&reg->lock);
        auto &al = reg->aliases[normalizedTypeName];
        if (al)
            return;
        al = metaType.d_ptr;
    }
}